

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamEntry::ParamEntry
          (ParamEntry *this,type_metatype t,int4 grp,int4 grpsize,Address *loc,int4 sz,int4 mnsz,
          int4 align,bool normalstack)

{
  int iVar1;
  
  this->flags = 0;
  this->type = t;
  this->group = grp;
  this->groupsize = grpsize;
  this->spaceid = loc->base;
  this->addressbase = loc->offset;
  this->size = sz;
  this->minsize = mnsz;
  this->alignment = align;
  if (align == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = sz / align;
  }
  this->numslots = iVar1;
  if (!normalstack) {
    this->flags = 2;
    resolveJoin(this);
    return;
  }
  resolveJoin(this);
  return;
}

Assistant:

ParamEntry::ParamEntry(type_metatype t,int4 grp,int4 grpsize,const Address &loc,int4 sz,int4 mnsz,int4 align,bool normalstack)

{
  flags = 0;
  type = t;
  group = grp;
  groupsize = grpsize;
  spaceid = loc.getSpace();
  addressbase = loc.getOffset();
  size = sz;
  minsize = mnsz;
  alignment = align;
  if (alignment != 0)
    numslots = size / alignment;
  else
    numslots = 1;
  if (!normalstack)
    flags |= reverse_stack;
  resolveJoin();
}